

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall
FloatInterval_SumOfProducts_Test::~FloatInterval_SumOfProducts_Test
          (FloatInterval_SumOfProducts_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FloatInterval, SumOfProducts) {
    for (int trial = 0; trial < kFloatIntervalIters; ++trial) {
        RNG rng(trial);

        // Make sure signs are mixed
        FloatInterval a = Abs(getFloat(rng));
        FloatInterval b = Abs(getFloat(rng));
        FloatInterval c = Abs(getFloat(rng));
        FloatInterval d = -Abs(getFloat(rng));

        Float sign = rng.Uniform<Float>() < -0.5 ? -1 : 1;
        b *= sign;
        c *= sign;

        double pa = getPrecise(a, rng);
        double pb = getPrecise(b, rng);
        double pc = getPrecise(c, rng);
        double pd = getPrecise(d, rng);

        FloatInterval r = SumOfProducts(a, b, c, d);
        double pr = SumOfProducts(pa, pb, pc, pd);

        EXPECT_GE(pr, r.LowerBound()) << trial;
        EXPECT_LE(pr, r.UpperBound()) << trial;
    }
}